

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dist.c
# Opt level: O0

int nn_dist_send(nn_dist *self,nn_msg *msg,nn_pipe *exclude)

{
  uint uVar1;
  nn_msg *pnVar2;
  char *pcVar3;
  long in_RDX;
  int *in_RDI;
  nn_msg copy;
  nn_dist_data *data;
  nn_list_item *it;
  int rc;
  undefined4 in_stack_ffffffffffffff48;
  uint32_t in_stack_ffffffffffffff4c;
  nn_msg *in_stack_ffffffffffffff50;
  FILE *__stream;
  nn_msg *local_a8;
  nn_msg *msg_00;
  nn_pipe *in_stack_ffffffffffffff68;
  nn_msg *local_30;
  
  if (*in_RDI == 0) {
    nn_msg_term((nn_msg *)0x1370ac);
  }
  else {
    nn_msg_bulkcopy_start(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
    local_30 = (nn_msg *)nn_list_begin((nn_list *)(in_RDI + 2));
    while (msg_00 = local_30, pnVar2 = (nn_msg *)nn_list_end((nn_list *)(in_RDI + 2)),
          msg_00 != pnVar2) {
      if (local_30 == (nn_msg *)0x0) {
        local_a8 = (nn_msg *)0x0;
      }
      else {
        local_a8 = local_30;
      }
      nn_msg_bulkcopy_cp(in_stack_ffffffffffffff50,
                         (nn_msg *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      if (*(long *)((long)&(local_a8->sphdr).u + 0x10) == in_RDX) {
        nn_msg_term((nn_msg *)0x13718b);
LAB_00137271:
        local_30 = (nn_msg *)
                   nn_list_next((nn_list *)in_stack_ffffffffffffff50,
                                (nn_list_item *)
                                CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      }
      else {
        uVar1 = nn_pipe_send(in_stack_ffffffffffffff68,msg_00);
        if ((int)uVar1 < 0) {
          nn_backtrace_print();
          __stream = _stderr;
          pcVar3 = nn_err_strerror(in_stack_ffffffffffffff4c);
          fprintf(__stream,"%s [%d] (%s:%d)\n",pcVar3,(ulong)-uVar1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/protocols/utils/dist.c"
                  ,0x5f);
          fflush(_stderr);
          nn_err_abort();
        }
        if ((uVar1 & 1) == 0) goto LAB_00137271;
        *in_RDI = *in_RDI + -1;
        local_30 = (nn_msg *)
                   nn_list_erase((nn_list *)in_stack_ffffffffffffff50,
                                 (nn_list_item *)
                                 CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      }
    }
    nn_msg_term((nn_msg *)0x1372a4);
  }
  return 0;
}

Assistant:

int nn_dist_send (struct nn_dist *self, struct nn_msg *msg,
    struct nn_pipe *exclude)
{
    int rc;
    struct nn_list_item *it;
    struct nn_dist_data *data;
    struct nn_msg copy;

    /*  TODO: We can optimise for the case when there's only one outbound
        pipe here. No message copying is needed in such case. */

    /*  In the specific case when there are no outbound pipes. There's nowhere
        to send the message to. Deallocate it. */
    if (nn_slow (self->count) == 0) {
        nn_msg_term (msg);
        return 0;
    }

    /*  Send the message to all the subscribers. */
    nn_msg_bulkcopy_start (msg, self->count);
    it = nn_list_begin (&self->pipes);
    while (it != nn_list_end (&self->pipes)) {
       data = nn_cont (it, struct nn_dist_data, item);
       nn_msg_bulkcopy_cp (&copy, msg);
       if (nn_fast (data->pipe == exclude)) {
           nn_msg_term (&copy);
       }
       else {
           rc = nn_pipe_send (data->pipe, &copy);
           errnum_assert (rc >= 0, -rc);
           if (rc & NN_PIPE_RELEASE) {
               --self->count;
               it = nn_list_erase (&self->pipes, it);
               continue;
           }
       }
       it = nn_list_next (&self->pipes, it);
    }
    nn_msg_term (msg);

    return 0;
}